

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

bool __thiscall
testing::internal::OptionalMatcher<const_char_*>::Impl<const_std::optional<const_char_*>_&>::
MatchAndExplain(Impl<const_std::optional<const_char_*>_&> *this,optional<const_char_*> *optional,
               MatchResultListener *listener)

{
  bool bVar1;
  MatchResultListener *pMVar2;
  ostream *os;
  char **value_00;
  string local_228;
  char *local_208;
  string local_200;
  byte local_1c9;
  undefined1 local_1c8 [7];
  bool match;
  StringMatchResultListener value_listener;
  ValueType *value;
  MatchResultListener *listener_local;
  optional<const_char_*> *optional_local;
  Impl<const_std::optional<const_char_*>_&> *this_local;
  
  bVar1 = std::optional::operator_cast_to_bool((optional *)optional);
  if (bVar1) {
    value_listener._400_8_ = std::optional<const_char_*>::operator*(optional);
    StringMatchResultListener::StringMatchResultListener((StringMatchResultListener *)local_1c8);
    local_1c9 = MatcherBase<const_char_*>::MatchAndExplain
                          (&(this->value_matcher_).super_MatcherBase<const_char_*>,
                           (char **)value_listener._400_8_,(MatchResultListener *)local_1c8);
    pMVar2 = MatchResultListener::operator<<(listener,(char (*) [13])"whose value ");
    PrintToString<char_const*>(&local_200,(testing *)value_listener._400_8_,value_00);
    pMVar2 = MatchResultListener::operator<<(pMVar2,&local_200);
    local_208 = " doesn\'t match";
    if ((local_1c9 & 1) != 0) {
      local_208 = " matches";
    }
    MatchResultListener::operator<<(pMVar2,&local_208);
    std::__cxx11::string::~string((string *)&local_200);
    StringMatchResultListener::str_abi_cxx11_(&local_228,(StringMatchResultListener *)local_1c8);
    os = MatchResultListener::stream(listener);
    PrintIfNotEmpty(&local_228,os);
    std::__cxx11::string::~string((string *)&local_228);
    this_local._7_1_ = (bool)(local_1c9 & 1);
    StringMatchResultListener::~StringMatchResultListener((StringMatchResultListener *)local_1c8);
  }
  else {
    MatchResultListener::operator<<(listener,(char (*) [21])"which is not engaged");
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool MatchAndExplain(Optional optional,
                         MatchResultListener* listener) const override {
      if (!optional) {
        *listener << "which is not engaged";
        return false;
      }
      const ValueType& value = *optional;
      StringMatchResultListener value_listener;
      const bool match = value_matcher_.MatchAndExplain(value, &value_listener);
      *listener << "whose value " << PrintToString(value)
                << (match ? " matches" : " doesn't match");
      PrintIfNotEmpty(value_listener.str(), listener->stream());
      return match;
    }